

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  pointer pFVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  Shareability SVar6;
  Shareability SVar7;
  HeapTypeKind HVar8;
  HeapTypeKind HVar9;
  Struct *pSVar10;
  Struct *pSVar11;
  long lVar12;
  HeapType a_00;
  HeapType b_00;
  ulong uVar13;
  Signature SVar14;
  Signature SVar15;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar4 = HeapType::isOpen(&local_40);
  bVar5 = HeapType::isOpen(&a_local);
  if (bVar4 == bVar5) {
    SVar6 = HeapType::getShared(&local_40);
    SVar7 = HeapType::getShared(&a_local);
    if ((SVar7 == Shared) == (SVar6 == Shared)) {
      HVar8 = HeapType::getKind(&local_40);
      HVar9 = HeapType::getKind(&a_local);
      if (HVar8 == HVar9) {
        switch(HVar8) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x240);
        case Func:
          SVar14 = HeapType::getSignature(&local_40);
          a_00.id = (uintptr_t)SVar14.results.id;
          SVar15 = HeapType::getSignature(&a_local);
          b_00.id = (uintptr_t)SVar15.results.id;
          bVar4 = shapeEq(SVar14.params.id,SVar15.params.id);
          if (bVar4) {
LAB_00ae7714:
            bVar4 = shapeEq((Type)a_00.id,(Type)b_00.id);
            return bVar4;
          }
          break;
        case Struct:
          pSVar10 = HeapType::getStruct(&local_40);
          pSVar11 = HeapType::getStruct(&a_local);
          pFVar1 = (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pFVar2 = (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((long)pFVar2 - (long)pFVar1 ==
              (long)(pSVar11->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar11->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            bVar4 = pFVar2 == pFVar1;
            if (bVar4) {
              return bVar4;
            }
            lVar12._0_4_ = pFVar1->packedType;
            lVar12._4_4_ = pFVar1->mutable_;
            pFVar2 = (pSVar11->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar3._0_4_ = pFVar2->packedType;
            lVar3._4_4_ = pFVar2->mutable_;
            if (lVar12 != lVar3) {
              return bVar4;
            }
            bVar5 = shapeEq((Type)(pFVar1->type).id,(Type)(pFVar2->type).id);
            if (!bVar5) {
              return bVar4;
            }
            uVar13 = 0;
            lVar12 = 0x18;
            while( true ) {
              uVar13 = uVar13 + 1;
              pFVar1 = (pSVar10->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar4 = (ulong)((long)(pSVar10->fields).
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)
                      <= uVar13;
              if (bVar4) {
                return bVar4;
              }
              pFVar2 = (pSVar11->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pFVar1->type).id + lVar12) !=
                  *(long *)((long)&(pFVar2->type).id + lVar12)) break;
              bVar5 = shapeEq((Type)*(uintptr_t *)((long)pFVar1 + lVar12 + -8),
                              (Type)*(uintptr_t *)((long)pFVar2 + lVar12 + -8));
              lVar12 = lVar12 + 0x10;
              if (!bVar5) {
                return bVar4;
              }
            }
            return bVar4;
          }
          break;
        case Array:
          HeapType::getArray(&local_60);
          HeapType::getArray(&local_50);
          b_00.id = local_50.id;
          a_00.id = local_60.id;
          if (local_58 == local_48) goto LAB_00ae7714;
          break;
        case Cont:
          handle_unreachable("TODO: cont",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x23e);
        }
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isOpen() != b.isOpen()) {
    return false;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  auto aKind = a.getKind();
  auto bKind = b.getKind();
  if (aKind != bKind) {
    return false;
  }
  switch (aKind) {
    case HeapTypeKind::Func:
      return shapeEq(a.getSignature(), b.getSignature());
    case HeapTypeKind::Struct:
      return shapeEq(a.getStruct(), b.getStruct());
    case HeapTypeKind::Array:
      return shapeEq(a.getArray(), b.getArray());
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  return false;
}